

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O3

REF_STATUS ref_subdiv_split_pyr(REF_SUBDIV ref_subdiv)

{
  size_t __size;
  REF_CELL pRVar1;
  REF_CELL pRVar2;
  REF_CELL pRVar3;
  REF_INT RVar4;
  uint uVar5;
  uint map;
  REF_STATUS RVar6;
  void *__s;
  ulong uVar7;
  undefined8 uVar8;
  REF_INT RVar9;
  char *pcVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  REF_INT new_cell;
  REF_CELL pyr_split;
  REF_CELL tet_split;
  REF_CELL pri_split;
  REF_INT local_144;
  REF_CELL local_140;
  REF_INT local_138;
  REF_INT RStack_134;
  REF_INT RStack_130;
  REF_INT RStack_12c;
  REF_INT local_128;
  REF_CELL local_c8;
  REF_CELL local_c0;
  REF_INT local_b8;
  REF_INT RStack_b4;
  REF_INT RStack_b0;
  REF_INT RStack_ac;
  REF_INT local_a8;
  REF_INT local_a4 [25];
  REF_CELL local_40;
  REF_CELL local_38;
  
  pRVar1 = ref_subdiv->grid->cell[9];
  iVar11 = pRVar1->max;
  if ((long)iVar11 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x719,
           "ref_subdiv_split_pyr","malloc marked_for_removal of REF_INT negative");
    uVar5 = 1;
  }
  else {
    __size = (long)iVar11 * 4;
    __s = malloc(__size);
    if (__s == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x719,"ref_subdiv_split_pyr","malloc marked_for_removal of REF_INT NULL");
      uVar5 = 2;
    }
    else {
      if (iVar11 != 0) {
        memset(__s,0,__size);
      }
      uVar5 = ref_cell_create(&local_140,pRVar1->type);
      if (uVar5 == 0) {
        pRVar2 = ref_subdiv->grid->cell[10];
        uVar5 = ref_cell_create(&local_c0,pRVar2->type);
        if (uVar5 == 0) {
          pRVar3 = ref_subdiv->grid->cell[8];
          uVar5 = ref_cell_create(&local_c8,pRVar3->type);
          if (uVar5 == 0) {
            local_40 = pRVar3;
            local_38 = pRVar2;
            if (0 < pRVar1->max) {
              uVar12 = 0;
              do {
                iVar11 = (int)uVar12;
                if (pRVar1->c2n[(long)iVar11 * (long)pRVar1->size_per] != -1) {
                  map = ref_subdiv_map(ref_subdiv,pRVar1,iVar11);
                  uVar5 = ref_cell_nodes(pRVar1,iVar11,&local_138);
                  RVar9 = RStack_12c;
                  if (uVar5 != 0) {
                    pcVar10 = "nodes";
                    uVar8 = 0x725;
                    goto LAB_001f43cd;
                  }
                  if ((int)map < 0x5c) {
                    if ((int)map < 0x22) {
                      if (map != 0) {
                        if (map != 0x14) {
LAB_001f573b:
                          ref_subdiv_map_to_edge(map);
                          printf("pyr %d, map %d\n",uVar12 & 0xffffffff,(ulong)map);
                          pcVar10 = "map not implemented yet";
                          uVar5 = 6;
                          uVar8 = 0x841;
                          uVar12 = 6;
                          goto LAB_001f43d0;
                        }
                        *(undefined4 *)((long)__s + uVar12 * 4) = 1;
                        uVar5 = ref_cell_nodes(pRVar1,iVar11,&local_b8);
                        if (uVar5 != 0) {
                          pcVar10 = "nodes";
                          uVar8 = 0x741;
                          goto LAB_001f43cd;
                        }
                        uVar5 = ref_subdiv_node_between(ref_subdiv,local_138,RStack_12c,&local_b8);
                        if (uVar5 != 0) {
                          pcVar10 = "mis";
                          uVar8 = 0x744;
                          goto LAB_001f43cd;
                        }
                        uVar5 = ref_subdiv_node_between(ref_subdiv,RStack_134,local_128,&RStack_b4);
                        if (uVar5 != 0) {
                          pcVar10 = "mis";
                          uVar8 = 0x747;
                          goto LAB_001f43cd;
                        }
                        uVar5 = ref_cell_add(local_140,&local_b8,&local_144);
                        if (uVar5 != 0) {
                          pcVar10 = "add";
                          uVar8 = 0x748;
                          goto LAB_001f43cd;
                        }
                        uVar5 = ref_cell_nodes(pRVar1,iVar11,&local_b8);
                        if (uVar5 != 0) {
                          pcVar10 = "nodes";
                          uVar8 = 0x74a;
                          goto LAB_001f43cd;
                        }
                        uVar5 = ref_subdiv_node_between(ref_subdiv,local_138,RStack_12c,&RStack_ac);
                        if (uVar5 != 0) {
                          pcVar10 = "mis";
                          uVar8 = 0x74d;
                          goto LAB_001f43cd;
                        }
                        uVar5 = ref_subdiv_node_between(ref_subdiv,RStack_134,local_128,&local_a8);
                        if (uVar5 != 0) {
                          pcVar10 = "mis";
                          uVar8 = 0x750;
                          goto LAB_001f43cd;
                        }
                        uVar5 = ref_cell_add(local_140,&local_b8,&local_144);
                        if (uVar5 != 0) {
                          pcVar10 = "add";
                          uVar8 = 0x751;
                          goto LAB_001f43cd;
                        }
                      }
                    }
                    else if (map == 0x22) {
                      *(undefined4 *)((long)__s + uVar12 * 4) = 1;
                      uVar5 = ref_cell_nodes(pRVar1,iVar11,&local_b8);
                      if (uVar5 != 0) {
                        pcVar10 = "nodes";
                        uVar8 = 0x76b;
                        goto LAB_001f43cd;
                      }
                      uVar5 = ref_subdiv_node_between(ref_subdiv,local_138,RStack_130,&local_b8);
                      if (uVar5 != 0) {
                        pcVar10 = "mis";
                        uVar8 = 0x76e;
                        goto LAB_001f43cd;
                      }
                      uVar5 = ref_subdiv_node_between(ref_subdiv,RStack_12c,RStack_130,&RStack_ac);
                      if (uVar5 != 0) {
                        pcVar10 = "mis";
                        uVar8 = 0x771;
                        goto LAB_001f43cd;
                      }
                      uVar5 = ref_cell_add(local_140,&local_b8,&local_144);
                      if (uVar5 != 0) {
                        pcVar10 = "add";
                        uVar8 = 0x772;
                        goto LAB_001f43cd;
                      }
                      uVar5 = ref_cell_nodes(pRVar1,iVar11,&local_b8);
                      if (uVar5 != 0) {
                        pcVar10 = "nodes";
                        uVar8 = 0x774;
                        goto LAB_001f43cd;
                      }
                      uVar5 = ref_subdiv_node_between(ref_subdiv,local_138,RStack_130,&RStack_b0);
                      if (uVar5 != 0) {
                        pcVar10 = "mis";
                        uVar8 = 0x777;
                        goto LAB_001f43cd;
                      }
                      uVar5 = ref_subdiv_node_between(ref_subdiv,RStack_12c,RStack_130,local_a4);
                      if (uVar5 != 0) {
                        pcVar10 = "mis";
                        uVar8 = 0x77a;
                        goto LAB_001f43cd;
                      }
                      uVar5 = ref_cell_add(local_c0,&local_b8,&local_144);
                      if (uVar5 != 0) {
                        pcVar10 = "add";
                        uVar8 = 0x77b;
                        goto LAB_001f43cd;
                      }
                    }
                    else if (map == 0x40) {
                      *(undefined4 *)((long)__s + uVar12 * 4) = 1;
                      uVar5 = ref_cell_nodes(pRVar1,iVar11,&local_b8);
                      if (uVar5 != 0) {
                        pcVar10 = "nodes";
                        uVar8 = 0x7c5;
                        goto LAB_001f43cd;
                      }
                      uVar5 = ref_subdiv_node_between(ref_subdiv,local_128,RStack_130,&RStack_b0);
                      if (uVar5 != 0) {
                        pcVar10 = "mis";
                        uVar8 = 0x7c8;
                        goto LAB_001f43cd;
                      }
                      uVar5 = ref_cell_add(local_140,&local_b8,&local_144);
                      if (uVar5 != 0) {
                        pcVar10 = "add";
                        uVar8 = 0x7c9;
                        goto LAB_001f43cd;
                      }
                      local_b8 = local_138;
                      RStack_b4 = RStack_134;
                      RStack_b0 = RStack_130;
                      uVar5 = ref_subdiv_node_between(ref_subdiv,local_128,RStack_130,&RStack_ac);
                      if (uVar5 != 0) {
                        pcVar10 = "mis";
                        uVar8 = 2000;
                        goto LAB_001f43cd;
                      }
                      uVar5 = ref_cell_add(local_c8,&local_b8,&local_144);
                      if (uVar5 != 0) {
                        pcVar10 = "add";
                        uVar8 = 0x7d1;
                        goto LAB_001f43cd;
                      }
                      local_b8 = local_138;
                      RStack_b4 = RStack_130;
                      RStack_b0 = RStack_12c;
                      uVar5 = ref_subdiv_node_between(ref_subdiv,local_128,RStack_130,&RStack_ac);
                      if (uVar5 != 0) {
                        pcVar10 = "mis";
                        uVar8 = 0x7d8;
                        goto LAB_001f43cd;
                      }
                      uVar5 = ref_cell_add(local_c8,&local_b8,&local_144);
                      if (uVar5 != 0) {
                        pcVar10 = "add";
                        uVar8 = 0x7d9;
                        goto LAB_001f43cd;
                      }
                    }
                    else {
                      if (map != 0x48) goto LAB_001f573b;
                      *(undefined4 *)((long)__s + uVar12 * 4) = 1;
                      uVar5 = ref_cell_nodes(pRVar1,iVar11,&local_b8);
                      if (uVar5 != 0) {
                        pcVar10 = "nodes";
                        uVar8 = 0x756;
                        goto LAB_001f43cd;
                      }
                      uVar5 = ref_subdiv_node_between(ref_subdiv,RStack_134,RStack_130,&RStack_b4);
                      if (uVar5 != 0) {
                        pcVar10 = "mis";
                        uVar8 = 0x759;
                        goto LAB_001f43cd;
                      }
                      uVar5 = ref_subdiv_node_between(ref_subdiv,local_128,RStack_130,&local_a8);
                      if (uVar5 != 0) {
                        pcVar10 = "mis";
                        uVar8 = 0x75c;
                        goto LAB_001f43cd;
                      }
                      uVar5 = ref_cell_add(local_140,&local_b8,&local_144);
                      if (uVar5 != 0) {
                        pcVar10 = "add";
                        uVar8 = 0x75d;
                        goto LAB_001f43cd;
                      }
                      uVar5 = ref_cell_nodes(pRVar1,iVar11,&local_b8);
                      if (uVar5 != 0) {
                        pcVar10 = "nodes";
                        uVar8 = 0x75f;
                        goto LAB_001f43cd;
                      }
                      uVar5 = ref_subdiv_node_between(ref_subdiv,RStack_134,RStack_130,&RStack_b0);
                      if (uVar5 != 0) {
                        pcVar10 = "mis";
                        uVar8 = 0x762;
                        goto LAB_001f43cd;
                      }
                      uVar5 = ref_subdiv_node_between(ref_subdiv,local_128,RStack_130,local_a4);
                      if (uVar5 != 0) {
                        pcVar10 = "mis";
                        uVar8 = 0x765;
                        goto LAB_001f43cd;
                      }
                      uVar5 = ref_cell_add(local_c0,&local_b8,&local_144);
                      if (uVar5 != 0) {
                        pcVar10 = "add";
                        uVar8 = 0x766;
                        goto LAB_001f43cd;
                      }
                    }
                  }
                  else if ((int)map < 0x8b) {
                    if (map == 0x5c) {
                      RStack_12c = local_138;
                      RVar4 = RStack_134;
                      RStack_134 = local_128;
                      local_128 = RVar9;
                      goto LAB_001f4d60;
                    }
                    if (map != 0x81) goto LAB_001f573b;
                    *(undefined4 *)((long)__s + uVar12 * 4) = 1;
                    uVar5 = ref_cell_nodes(pRVar1,iVar11,&local_b8);
                    if (uVar5 != 0) {
                      pcVar10 = "nodes";
                      uVar8 = 0x72c;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_subdiv_node_between(ref_subdiv,local_138,RStack_134,&local_b8);
                    if (uVar5 != 0) {
                      pcVar10 = "mis";
                      uVar8 = 0x72f;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_subdiv_node_between(ref_subdiv,RStack_12c,local_128,&RStack_ac);
                    if (uVar5 != 0) {
                      pcVar10 = "mis";
                      uVar8 = 0x732;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_cell_add(local_140,&local_b8,&local_144);
                    if (uVar5 != 0) {
                      pcVar10 = "add";
                      uVar8 = 0x733;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_cell_nodes(pRVar1,iVar11,&local_b8);
                    if (uVar5 != 0) {
                      pcVar10 = "nodes";
                      uVar8 = 0x735;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_subdiv_node_between(ref_subdiv,local_138,RStack_134,&RStack_b4);
                    if (uVar5 != 0) {
                      pcVar10 = "mis";
                      uVar8 = 0x738;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_subdiv_node_between(ref_subdiv,RStack_12c,local_128,&local_a8);
                    if (uVar5 != 0) {
                      pcVar10 = "mis";
                      uVar8 = 0x73b;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_cell_add(local_140,&local_b8,&local_144);
                    if (uVar5 != 0) {
                      pcVar10 = "add";
                      uVar8 = 0x73c;
                      goto LAB_001f43cd;
                    }
                  }
                  else if (map == 0xeb) {
                    *(undefined4 *)((long)__s + uVar12 * 4) = 1;
                    uVar5 = ref_cell_nodes(pRVar1,iVar11,&local_b8);
                    if (uVar5 != 0) {
                      pcVar10 = "nodes";
                      uVar8 = 0x780;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_subdiv_node_between(ref_subdiv,local_138,RStack_130,&local_b8);
                    if (uVar5 != 0) {
                      pcVar10 = "mis";
                      uVar8 = 0x783;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_subdiv_node_between(ref_subdiv,RStack_134,RStack_130,&RStack_b4);
                    if (uVar5 != 0) {
                      pcVar10 = "mis";
                      uVar8 = 0x786;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_subdiv_node_between(ref_subdiv,RStack_12c,RStack_130,&RStack_ac);
                    if (uVar5 != 0) {
                      pcVar10 = "mis";
                      uVar8 = 0x789;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_subdiv_node_between(ref_subdiv,local_128,RStack_130,&local_a8);
                    if (uVar5 != 0) {
                      pcVar10 = "mis";
                      uVar8 = 0x78c;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_cell_add(local_140,&local_b8,&local_144);
                    if (uVar5 != 0) {
                      pcVar10 = "add";
                      uVar8 = 0x78d;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_subdiv_node_between(ref_subdiv,local_138,RStack_134,&local_b8);
                    if (uVar5 != 0) {
                      pcVar10 = "mis";
                      uVar8 = 0x791;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_subdiv_node_between(ref_subdiv,RStack_134,RStack_130,&RStack_b4);
                    if (uVar5 != 0) {
                      pcVar10 = "mis";
                      uVar8 = 0x794;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_subdiv_node_between(ref_subdiv,RStack_130,local_138,&RStack_b0);
                    if (uVar5 != 0) {
                      pcVar10 = "mis";
                      uVar8 = 0x797;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_subdiv_node_between(ref_subdiv,RStack_12c,local_128,&RStack_ac);
                    if (uVar5 != 0) {
                      pcVar10 = "mis";
                      uVar8 = 0x79a;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_subdiv_node_between(ref_subdiv,local_128,RStack_130,&local_a8);
                    if (uVar5 != 0) {
                      pcVar10 = "mis";
                      uVar8 = 0x79d;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_subdiv_node_between(ref_subdiv,RStack_130,RStack_12c,local_a4);
                    if (uVar5 != 0) {
                      pcVar10 = "mis";
                      uVar8 = 0x7a0;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_cell_add(local_c0,&local_b8,&local_144);
                    if (uVar5 != 0) {
                      pcVar10 = "add";
                      uVar8 = 0x7a1;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_cell_nodes(pRVar1,iVar11,&local_b8);
                    if (uVar5 != 0) {
                      pcVar10 = "nodes";
                      uVar8 = 0x7a3;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_subdiv_node_between(ref_subdiv,local_138,RStack_134,&RStack_b4);
                    if (uVar5 != 0) {
                      pcVar10 = "mis";
                      uVar8 = 0x7a6;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_subdiv_node_between(ref_subdiv,local_138,RStack_130,&RStack_b0);
                    if (uVar5 != 0) {
                      pcVar10 = "mis";
                      uVar8 = 0x7a9;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_subdiv_node_between(ref_subdiv,RStack_12c,local_128,&local_a8);
                    if (uVar5 != 0) {
                      pcVar10 = "mis";
                      uVar8 = 0x7ac;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_subdiv_node_between(ref_subdiv,RStack_12c,RStack_130,local_a4);
                    if (uVar5 != 0) {
                      pcVar10 = "mis";
                      uVar8 = 0x7af;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_cell_add(local_c0,&local_b8,&local_144);
                    if (uVar5 != 0) {
                      pcVar10 = "add";
                      uVar8 = 0x7b0;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_cell_nodes(pRVar1,iVar11,&local_b8);
                    if (uVar5 != 0) {
                      pcVar10 = "nodes";
                      uVar8 = 0x7b2;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_subdiv_node_between(ref_subdiv,local_138,RStack_134,&local_b8);
                    if (uVar5 != 0) {
                      pcVar10 = "mis";
                      uVar8 = 0x7b5;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_subdiv_node_between(ref_subdiv,RStack_134,RStack_130,&RStack_b0);
                    if (uVar5 != 0) {
                      pcVar10 = "mis";
                      uVar8 = 0x7b8;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_subdiv_node_between(ref_subdiv,RStack_12c,local_128,&RStack_ac);
                    if (uVar5 != 0) {
                      pcVar10 = "mis";
                      uVar8 = 0x7bb;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_subdiv_node_between(ref_subdiv,local_128,RStack_130,local_a4);
                    if (uVar5 != 0) {
                      pcVar10 = "mis";
                      uVar8 = 0x7be;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_cell_add(local_c0,&local_b8,&local_144);
                    if (uVar5 != 0) {
                      pcVar10 = "add";
                      uVar8 = 0x7bf;
                      goto LAB_001f43cd;
                    }
                  }
                  else {
                    if (map == 0xe1) {
                      RStack_12c = RStack_134;
                      RVar4 = local_128;
                      RStack_134 = RVar9;
                      local_128 = local_138;
                    }
                    else {
                      RVar4 = local_138;
                      if (map != 0x8b) goto LAB_001f573b;
                    }
LAB_001f4d60:
                    local_138 = RVar4;
                    *(undefined4 *)((long)__s + uVar12 * 4) = 1;
                    local_a8 = local_128;
                    local_b8 = local_138;
                    RStack_b4 = RStack_134;
                    RStack_b0 = RStack_130;
                    RStack_ac = RStack_12c;
                    uVar5 = ref_subdiv_node_between(ref_subdiv,local_138,RStack_134,&local_b8);
                    if (uVar5 != 0) {
                      pcVar10 = "mis";
                      uVar8 = 0x7f7;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_subdiv_node_between(ref_subdiv,RStack_12c,local_128,&RStack_ac);
                    if (uVar5 != 0) {
                      pcVar10 = "mis";
                      uVar8 = 0x7fa;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_subdiv_node_between(ref_subdiv,RStack_134,RStack_130,&RStack_b0);
                    if (uVar5 != 0) {
                      pcVar10 = "mis";
                      uVar8 = 0x7fd;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_cell_add(local_140,&local_b8,&local_144);
                    if (uVar5 != 0) {
                      pcVar10 = "add";
                      uVar8 = 0x7fe;
                      goto LAB_001f43cd;
                    }
                    local_a8 = local_128;
                    local_b8 = local_138;
                    RStack_b4 = RStack_134;
                    RStack_b0 = RStack_130;
                    RStack_ac = RStack_12c;
                    uVar5 = ref_subdiv_node_between(ref_subdiv,local_138,RStack_134,&RStack_b4);
                    if (uVar5 != 0) {
                      pcVar10 = "mis";
                      uVar8 = 0x803;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_subdiv_node_between(ref_subdiv,RStack_12c,local_128,&local_a8);
                    if (uVar5 != 0) {
                      pcVar10 = "mis";
                      uVar8 = 0x806;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_subdiv_node_between(ref_subdiv,local_138,RStack_130,&RStack_b0);
                    if (uVar5 != 0) {
                      pcVar10 = "mis";
                      uVar8 = 0x809;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_cell_add(local_140,&local_b8,&local_144);
                    if (uVar5 != 0) {
                      pcVar10 = "add";
                      uVar8 = 0x80a;
                      goto LAB_001f43cd;
                    }
                    RStack_b4 = RStack_134;
                    RStack_b0 = RStack_130;
                    RStack_ac = RStack_12c;
                    local_a8 = local_128;
                    local_b8 = local_128;
                    uVar5 = ref_subdiv_node_between(ref_subdiv,RStack_12c,local_128,&RStack_b4);
                    if (uVar5 != 0) {
                      pcVar10 = "mis";
                      uVar8 = 0x811;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_subdiv_node_between(ref_subdiv,RStack_134,RStack_130,&RStack_ac);
                    if (uVar5 != 0) {
                      pcVar10 = "mis";
                      uVar8 = 0x814;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_cell_add(local_c8,&local_b8,&local_144);
                    if (uVar5 != 0) {
                      pcVar10 = "add";
                      uVar8 = 0x815;
                      goto LAB_001f43cd;
                    }
                    local_a8 = local_128;
                    local_b8 = local_138;
                    RStack_b4 = RStack_134;
                    RStack_b0 = RStack_130;
                    RStack_ac = RStack_12c;
                    uVar5 = ref_subdiv_node_between(ref_subdiv,RStack_12c,local_128,&local_b8);
                    if (uVar5 != 0) {
                      pcVar10 = "mis";
                      uVar8 = 0x81a;
                      goto LAB_001f43cd;
                    }
                    RStack_b4 = RStack_ac;
                    uVar5 = ref_subdiv_node_between(ref_subdiv,local_138,RStack_130,&RStack_ac);
                    if (uVar5 != 0) {
                      pcVar10 = "mis";
                      uVar8 = 0x81e;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_cell_add(local_c8,&local_b8,&local_144);
                    if (uVar5 != 0) {
                      pcVar10 = "add";
                      uVar8 = 0x81f;
                      goto LAB_001f43cd;
                    }
                    local_a8 = local_128;
                    local_b8 = local_138;
                    RStack_b4 = RStack_134;
                    RStack_b0 = RStack_130;
                    RStack_ac = RStack_12c;
                    uVar5 = ref_subdiv_node_between(ref_subdiv,local_138,RStack_130,&local_b8);
                    if (uVar5 != 0) {
                      pcVar10 = "mis";
                      uVar8 = 0x825;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_subdiv_node_between(ref_subdiv,RStack_134,RStack_130,&RStack_b4);
                    if (uVar5 != 0) {
                      pcVar10 = "mis";
                      uVar8 = 0x828;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_subdiv_node_between(ref_subdiv,RStack_12c,local_128,&RStack_ac);
                    if (uVar5 != 0) {
                      pcVar10 = "mis";
                      uVar8 = 0x82b;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_cell_add(local_c8,&local_b8,&local_144);
                    if (uVar5 != 0) {
                      pcVar10 = "add";
                      uVar8 = 0x82c;
                      goto LAB_001f43cd;
                    }
                    local_a8 = local_128;
                    local_b8 = local_138;
                    RStack_b4 = RStack_134;
                    RStack_b0 = RStack_130;
                    RStack_ac = RStack_12c;
                    uVar5 = ref_subdiv_node_between(ref_subdiv,local_138,RStack_130,&local_b8);
                    if (uVar5 != 0) {
                      pcVar10 = "mis";
                      uVar8 = 0x831;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_subdiv_node_between(ref_subdiv,local_138,RStack_134,&RStack_b4);
                    if (uVar5 != 0) {
                      pcVar10 = "mis";
                      uVar8 = 0x834;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_subdiv_node_between(ref_subdiv,RStack_134,RStack_130,&RStack_b0);
                    if (uVar5 != 0) {
                      pcVar10 = "mis";
                      uVar8 = 0x837;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_subdiv_node_between(ref_subdiv,RStack_12c,local_128,&RStack_ac);
                    if (uVar5 != 0) {
                      pcVar10 = "mis";
                      uVar8 = 0x83a;
                      goto LAB_001f43cd;
                    }
                    uVar5 = ref_cell_add(local_c8,&local_b8,&local_144);
                    if (uVar5 != 0) {
                      pcVar10 = "add";
                      uVar8 = 0x83b;
                      goto LAB_001f43cd;
                    }
                  }
                }
                uVar12 = uVar12 + 1;
                uVar7 = (ulong)pRVar1->max;
              } while ((long)uVar12 < (long)uVar7);
              if (0 < pRVar1->max) {
                lVar13 = 0;
                do {
                  if (*(int *)((long)__s + lVar13 * 4) == 1) {
                    uVar5 = ref_cell_remove(pRVar1,(REF_INT)lVar13);
                    if (uVar5 != 0) {
                      pcVar10 = "remove";
                      uVar8 = 0x847;
                      goto LAB_001f43cd;
                    }
                    uVar7 = (ulong)(uint)pRVar1->max;
                  }
                  lVar13 = lVar13 + 1;
                } while (lVar13 < (int)uVar7);
              }
            }
            if (0 < local_140->max) {
              iVar11 = 0;
              do {
                RVar6 = ref_cell_nodes(local_140,iVar11,&local_138);
                if ((RVar6 == 0) &&
                   (uVar5 = ref_subdiv_add_local_cell
                                      ((REF_SUBDIV)ref_subdiv->grid,pRVar1,&local_138), uVar5 != 0))
                {
                  pcVar10 = "add local";
                  uVar8 = 0x84a;
                  goto LAB_001f43cd;
                }
                iVar11 = iVar11 + 1;
              } while (iVar11 < local_140->max);
            }
            pRVar1 = local_40;
            if (0 < local_c0->max) {
              RVar9 = 0;
              do {
                RVar6 = ref_cell_nodes(local_c0,RVar9,&local_138);
                if ((RVar6 == 0) &&
                   (uVar5 = ref_subdiv_add_local_cell
                                      ((REF_SUBDIV)ref_subdiv->grid,local_38,&local_138), uVar5 != 0
                   )) {
                  pcVar10 = "add local";
                  uVar8 = 0x84d;
                  goto LAB_001f43cd;
                }
                RVar9 = RVar9 + 1;
              } while (RVar9 < local_c0->max);
            }
            if (0 < local_c8->max) {
              iVar11 = 0;
              do {
                RVar6 = ref_cell_nodes(local_c8,iVar11,&local_138);
                if ((RVar6 == 0) &&
                   (uVar5 = ref_subdiv_add_local_cell
                                      ((REF_SUBDIV)ref_subdiv->grid,pRVar1,&local_138), uVar5 != 0))
                {
                  pcVar10 = "add local";
                  uVar8 = 0x850;
                  goto LAB_001f43cd;
                }
                iVar11 = iVar11 + 1;
              } while (iVar11 < local_c8->max);
            }
            uVar5 = ref_cell_free(local_140);
            if (uVar5 == 0) {
              uVar5 = ref_cell_free(local_c0);
              if (uVar5 == 0) {
                uVar5 = ref_cell_free(local_c8);
                if (uVar5 == 0) {
                  free(__s);
                  return 0;
                }
                pcVar10 = "temp pri free";
                uVar8 = 0x854;
              }
              else {
                pcVar10 = "temp pri free";
                uVar8 = 0x853;
              }
            }
            else {
              pcVar10 = "temp pyr free";
              uVar8 = 0x852;
            }
          }
          else {
            pcVar10 = "temp pri";
            uVar8 = 0x721;
          }
        }
        else {
          pcVar10 = "temp pri";
          uVar8 = 0x71e;
        }
      }
      else {
        pcVar10 = "temp pyr";
        uVar8 = 0x71b;
      }
LAB_001f43cd:
      uVar12 = (ulong)uVar5;
LAB_001f43d0:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             uVar8,"ref_subdiv_split_pyr",uVar12,pcVar10);
    }
  }
  return uVar5;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_split_pyr(REF_SUBDIV ref_subdiv) {
  REF_INT cell;
  REF_CELL pyr, pri, tet;
  REF_CELL pyr_split, pri_split, tet_split;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_cell;
  REF_INT *marked_for_removal;

  REF_INT map;
  REF_INT node;

  pyr = ref_grid_pyr(ref_subdiv_grid(ref_subdiv));

  ref_malloc_init(marked_for_removal, ref_cell_max(pyr), REF_INT, 0);

  RSS(ref_cell_create(&pyr_split, ref_cell_type(pyr)), "temp pyr");

  pri = ref_grid_pri(ref_subdiv_grid(ref_subdiv));
  RSS(ref_cell_create(&pri_split, ref_cell_type(pri)), "temp pri");

  tet = ref_grid_tet(ref_subdiv_grid(ref_subdiv));
  RSS(ref_cell_create(&tet_split, ref_cell_type(tet)), "temp pri");

  each_ref_cell_valid_cell(pyr, cell) {
    map = ref_subdiv_map(ref_subdiv, pyr, cell);
    RSS(ref_cell_nodes(pyr, cell, nodes), "nodes");
    switch (map) {
      case 0: /* don't split */
        break;
      case 129: /* split into two pyr on edges 0, 7*/
        marked_for_removal[cell] = 1;

        RSS(ref_cell_nodes(pyr, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_cell_add(pyr_split, new_nodes, &new_cell), "add");

        RSS(ref_cell_nodes(pyr, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[4])),
            "mis");
        RSS(ref_cell_add(pyr_split, new_nodes, &new_cell), "add");
        break;
      case 20: /* split into two pyr on edges 2, 4*/
        marked_for_removal[cell] = 1;

        RSS(ref_cell_nodes(pyr, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[3],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[4],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_cell_add(pyr_split, new_nodes, &new_cell), "add");

        RSS(ref_cell_nodes(pyr, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[3],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[4],
                                    &(new_nodes[4])),
            "mis");
        RSS(ref_cell_add(pyr_split, new_nodes, &new_cell), "add");
        break;
      case 72: /* split into pyr and pri edge 3-6 */
        marked_for_removal[cell] = 1;

        RSS(ref_cell_nodes(pyr, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[4], nodes[2],
                                    &(new_nodes[4])),
            "mis");
        RSS(ref_cell_add(pyr_split, new_nodes, &new_cell), "add");

        RSS(ref_cell_nodes(pyr, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[4], nodes[2],
                                    &(new_nodes[5])),
            "mis");
        RSS(ref_cell_add(pri_split, new_nodes, &new_cell), "add");
        break;
      case 34: /* split into pyr and pri edge 1-5 */
        marked_for_removal[cell] = 1;

        RSS(ref_cell_nodes(pyr, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[2],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_cell_add(pyr_split, new_nodes, &new_cell), "add");

        RSS(ref_cell_nodes(pyr, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[2],
                                    &(new_nodes[5])),
            "mis");
        RSS(ref_cell_add(pri_split, new_nodes, &new_cell), "add");
        break;
      case 235: /* split into 1 pyr, 2 pri*/
        marked_for_removal[cell] = 1;

        RSS(ref_cell_nodes(pyr, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[2],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[4], nodes[2],
                                    &(new_nodes[4])),
            "mis");
        RSS(ref_cell_add(pyr_split, new_nodes, &new_cell), "add");

        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[0],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[4], nodes[2],
                                    &(new_nodes[4])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[3],
                                    &(new_nodes[5])),
            "mis");
        RSS(ref_cell_add(pri_split, new_nodes, &new_cell), "add");

        RSS(ref_cell_nodes(pyr, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[4])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[2],
                                    &(new_nodes[5])),
            "mis");
        RSS(ref_cell_add(pri_split, new_nodes, &new_cell), "add");

        RSS(ref_cell_nodes(pyr, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[4], nodes[2],
                                    &(new_nodes[5])),
            "mis");
        RSS(ref_cell_add(pri_split, new_nodes, &new_cell), "add");

        break;
      case 64: /* split into 1 pyr, 3 tet, on edge 6, nodes 2, 4*/
        marked_for_removal[cell] = 1;

        RSS(ref_cell_nodes(pyr, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[4], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_cell_add(pyr_split, new_nodes, &new_cell), "add");

        new_nodes[0] = nodes[0];
        new_nodes[1] = nodes[1];
        new_nodes[2] = nodes[2];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[4], nodes[2],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_cell_add(tet_split, new_nodes, &new_cell), "add");

        new_nodes[0] = nodes[0];
        new_nodes[1] = nodes[2];
        new_nodes[2] = nodes[3];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[4], nodes[2],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_cell_add(tet_split, new_nodes, &new_cell), "add");

        break;
      case 139:
      case 225:
      case 92:

        if (225 == map) {
          for (node = 0; node < 5; node++) new_nodes[node] = nodes[node];
          nodes[0] = new_nodes[4];
          nodes[1] = new_nodes[3];
          nodes[2] = new_nodes[2];
          nodes[3] = new_nodes[1];
          nodes[4] = new_nodes[0];
        }

        if (92 == map) {
          for (node = 0; node < 5; node++) new_nodes[node] = nodes[node];
          nodes[0] = new_nodes[1];
          nodes[1] = new_nodes[4];
          nodes[2] = new_nodes[2];
          nodes[3] = new_nodes[0];
          nodes[4] = new_nodes[3];
        }

        marked_for_removal[cell] = 1;

        for (node = 0; node < 5; node++) new_nodes[node] = nodes[node];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_cell_add(pyr_split, new_nodes, &new_cell), "add");

        for (node = 0; node < 5; node++) new_nodes[node] = nodes[node];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[4])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_cell_add(pyr_split, new_nodes, &new_cell), "add");

        /* top sides */
        for (node = 0; node < 5; node++) new_nodes[node] = nodes[node];
        new_nodes[0] = new_nodes[4];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_cell_add(tet_split, new_nodes, &new_cell), "add");

        for (node = 0; node < 5; node++) new_nodes[node] = nodes[node];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[0])),
            "mis");
        new_nodes[1] = new_nodes[3];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_cell_add(tet_split, new_nodes, &new_cell), "add");

        /* center */
        for (node = 0; node < 5; node++) new_nodes[node] = nodes[node];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_cell_add(tet_split, new_nodes, &new_cell), "add");

        for (node = 0; node < 5; node++) new_nodes[node] = nodes[node];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_cell_add(tet_split, new_nodes, &new_cell), "add");

        break;
      default:
        RSS(ref_subdiv_map_to_edge(map), "map2edge");
        printf("pyr %d, map %d\n", cell, map);
        RSS(REF_IMPLEMENT, "map not implemented yet")
    }
  }

  for (cell = 0; cell < ref_cell_max(pyr); cell++)
    if (1 == marked_for_removal[cell])
      RSS(ref_cell_remove(pyr, cell), "remove");

  each_ref_cell_valid_cell_with_nodes(pyr_split, cell, nodes)
      RSS(ref_subdiv_add_local_cell(ref_subdiv, pyr, nodes), "add local");

  each_ref_cell_valid_cell_with_nodes(pri_split, cell, nodes)
      RSS(ref_subdiv_add_local_cell(ref_subdiv, pri, nodes), "add local");

  each_ref_cell_valid_cell_with_nodes(tet_split, cell, nodes)
      RSS(ref_subdiv_add_local_cell(ref_subdiv, tet, nodes), "add local");

  RSS(ref_cell_free(pyr_split), "temp pyr free");
  RSS(ref_cell_free(pri_split), "temp pri free");
  RSS(ref_cell_free(tet_split), "temp pri free");

  free(marked_for_removal);

  return REF_SUCCESS;
}